

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char> __thiscall
fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned_long>
          (detail *this,basic_appender<char> out,write_int_arg<unsigned_long> arg,
          format_specs *specs)

{
  byte *end;
  uint uVar1;
  uint prefix;
  basic_appender<char> bVar2;
  ulong uVar3;
  uint uVar4;
  format_specs *specs_00;
  char *pcVar5;
  long lVar6;
  buffer<char> *buf;
  int num_digits;
  byte *pbVar7;
  bool bVar8;
  size_padding sp;
  char buffer [64];
  size_padding local_98;
  anon_class_24_4_0fb5e8cf local_90;
  char local_78 [63];
  byte local_39 [9];
  
  specs_00 = arg._8_8_;
  uVar4 = (specs_00->super_basic_specs).data_;
  if (7 < ((byte)uVar4 & 7)) {
switchD_001e2fac_caseD_1:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format.h"
                ,0x7ee,"");
  }
  prefix = (uint)arg.abs_value;
  end = local_39 + 1;
  pbVar7 = end;
  switch(uVar4 & 7) {
  default:
    pbVar7 = (byte *)do_format_decimal<char,unsigned_long>
                               (local_78,(unsigned_long)out.container,0x40);
    goto LAB_001e30fc;
  case 1:
  case 2:
    goto switchD_001e2fac_caseD_1;
  case 4:
    pcVar5 = "0123456789ABCDEF";
    if ((uVar4 >> 0xc & 1) == 0) {
      pcVar5 = "0123456789abcdef";
    }
    do {
      pbVar7[-1] = pcVar5[(uint)out.container & 0xf];
      pbVar7 = pbVar7 + -1;
      bVar8 = (buffer<char> *)0xf < out.container;
      out.container = out.container >> 4;
    } while (bVar8);
    if ((uVar4 >> 0xd & 1) == 0) goto LAB_001e30fc;
    uVar4 = (uint)((uVar4 >> 0xc & 1) == 0) << 0xd | 0x5830;
    break;
  case 5:
    lVar6 = 0;
    bVar2.container = out.container;
    do {
      pbVar7[-1] = (byte)bVar2.container & 7 | 0x30;
      pbVar7 = pbVar7 + -1;
      lVar6 = lVar6 + 1;
      bVar8 = (buffer<char> *)0x7 < bVar2.container;
      bVar2.container = bVar2.container >> 3;
    } while (bVar8);
    if (((uVar4 >> 0xd & 1) != 0) &&
       (out.container != (buffer<char> *)0x0 && specs_00->precision <= lVar6)) {
      uVar4 = 0x3000;
      if (prefix == 0) {
        uVar4 = 0x30;
      }
      prefix = (uVar4 | prefix) + 0x1000000;
    }
    goto LAB_001e30fc;
  case 6:
    do {
      pbVar7[-1] = (byte)out.container & 1 | 0x30;
      pbVar7 = pbVar7 + -1;
      bVar8 = (buffer<char> *)0x1 < out.container;
      out.container = out.container >> 1;
    } while (bVar8);
    if ((uVar4 >> 0xd & 1) == 0) goto LAB_001e30fc;
    uVar4 = (uint)((uVar4 >> 0xc & 1) == 0) << 0xd | 0x4230;
    break;
  case 7:
    local_90.prefix._0_2_ = CONCAT11((char)out.container,(uVar4 & 7) == 1);
    bVar2 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      ((basic_appender<char>)this,specs_00,1,1,(anon_class_2_2_bf5026b7 *)&local_90)
    ;
    return (basic_appender<char>)bVar2.container;
  }
  uVar1 = uVar4 << 8;
  if (prefix == 0) {
    uVar1 = uVar4;
  }
  prefix = (uVar1 | prefix) + 0x2000000;
LAB_001e30fc:
  num_digits = (int)end - (int)pbVar7;
  if (specs_00->precision == -1 && specs_00->width == 0) {
    if (num_digits < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/base.h"
                  ,0x1b6,"negative value");
    }
    uVar3 = (ulong)((prefix >> 0x18) + num_digits) + *(long *)(this + 8);
    if (*(ulong *)(this + 0x10) < uVar3) {
      (**(code **)(this + 0x18))(this,uVar3);
    }
    uVar4 = prefix & 0xffffff;
    if ((prefix & 0xffffff) != 0) {
      do {
        lVar6 = *(long *)(this + 8);
        uVar3 = lVar6 + 1;
        if (*(ulong *)(this + 0x10) < uVar3) {
          (**(code **)(this + 0x18))(this);
          lVar6 = *(long *)(this + 8);
          uVar3 = lVar6 + 1;
        }
        *(ulong *)(this + 8) = uVar3;
        *(char *)(*(long *)this + lVar6) = (char)uVar4;
        bVar8 = 0xff < uVar4;
        uVar4 = uVar4 >> 8;
      } while (bVar8);
    }
    buffer<char>::append<char>((buffer<char> *)this,(char *)pbVar7,(char *)end);
  }
  else {
    size_padding::size_padding(&local_98,num_digits,prefix,specs_00);
    local_90.padding = local_98.padding;
    local_90.prefix = prefix;
    local_90.begin = (char *)pbVar7;
    local_90.end = (char *)end;
    this = (detail *)
           write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned_long>(fmt::v11::basic_appender<char>,fmt::v11::detail::write_int_arg<unsigned_long>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                     ((basic_appender<char>)this,specs_00,(ulong)local_98.size,(ulong)local_98.size,
                      &local_90);
  }
  return (basic_appender<char>)(buffer<char> *)this;
}

Assistant:

FMT_CONSTEXPR FMT_INLINE auto write_int(OutputIt out, write_int_arg<T> arg,
                                        const format_specs& specs) -> OutputIt {
  static_assert(std::is_same<T, uint32_or_64_or_128_t<T>>::value, "");

  constexpr int buffer_size = num_bits<T>();
  char buffer[buffer_size];
  if (is_constant_evaluated()) fill_n(buffer, buffer_size, '\0');
  const char* begin = nullptr;
  const char* end = buffer + buffer_size;

  auto abs_value = arg.abs_value;
  auto prefix = arg.prefix;
  switch (specs.type()) {
  default: FMT_ASSERT(false, ""); FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    begin = do_format_decimal(buffer, abs_value, buffer_size);
    break;
  case presentation_type::hex:
    begin = do_format_base2e(4, buffer, abs_value, buffer_size, specs.upper());
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'X' : 'x') << 8 | '0');
    break;
  case presentation_type::oct: {
    begin = do_format_base2e(3, buffer, abs_value, buffer_size);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    auto num_digits = end - begin;
    if (specs.alt() && specs.precision <= num_digits && abs_value != 0)
      prefix_append(prefix, '0');
    break;
  }
  case presentation_type::bin:
    begin = do_format_base2e(1, buffer, abs_value, buffer_size);
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'B' : 'b') << 8 | '0');
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(abs_value), specs);
  }

  // Write an integer in the format
  //   <left-padding><prefix><numeric-padding><digits><right-padding>
  // prefix contains chars in three lower bytes and the size in the fourth byte.
  int num_digits = static_cast<int>(end - begin);
  // Slightly faster check for specs.width == 0 && specs.precision == -1.
  if ((specs.width | (specs.precision + 1)) == 0) {
    auto it = reserve(out, to_unsigned(num_digits) + (prefix >> 24));
    for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
      *it++ = static_cast<Char>(p & 0xff);
    return base_iterator(out, copy<Char>(begin, end, it));
  }
  auto sp = size_padding(num_digits, prefix, specs);
  unsigned padding = sp.padding;
  return write_padded<Char, align::right>(
      out, specs, sp.size, [=](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        it = detail::fill_n(it, padding, static_cast<Char>('0'));
        return copy<Char>(begin, end, it);
      });
}